

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_free(REF_GEOM ref_geom)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uStack_20;
  
  if (ref_geom == (REF_GEOM)0x0) {
    return 2;
  }
  ref_facelift_free(ref_geom->ref_facelift);
  free(ref_geom->cad_data);
  free(ref_geom->e2f);
  if ((ref_geom->contex_owned == 0) || (uVar1 = ref_egads_close(ref_geom), uVar1 == 0)) {
    uVar1 = ref_adj_free(ref_geom->ref_adj);
    if (uVar1 == 0) {
      free(ref_geom->face_seg_per_rad);
      free(ref_geom->face_min_length);
      free(ref_geom->initial_cell_height);
      free(ref_geom->uv_area_sign);
      free(ref_geom->param);
      free(ref_geom->descr);
      free(ref_geom);
      return 0;
    }
    pcVar2 = "adj free";
    uStack_20 = 0x79;
  }
  else {
    pcVar2 = "close egads contex";
    uStack_20 = 0x78;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uStack_20,
         "ref_geom_free",(ulong)uVar1,pcVar2);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_free(REF_GEOM ref_geom) {
  if (NULL == (void *)ref_geom) return REF_NULL;
  ref_facelift_free(ref_geom_facelift(ref_geom));
  ref_free(ref_geom->cad_data);
  ref_free(ref_geom->e2f);
  if (ref_geom->contex_owned)
    RSS(ref_egads_close(ref_geom), "close egads contex");
  RSS(ref_adj_free(ref_geom->ref_adj), "adj free");
  ref_free(ref_geom->face_seg_per_rad);
  ref_free(ref_geom->face_min_length);
  ref_free(ref_geom->initial_cell_height);
  ref_free(ref_geom->uv_area_sign);
  ref_free(ref_geom->param);
  ref_free(ref_geom->descr);
  ref_free(ref_geom);
  return REF_SUCCESS;
}